

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OPostDecrement(_Type_CLASS_OBJECT *this,Variable *object)

{
  bool bVar1;
  Object *pOVar2;
  ClassObject *pCVar3;
  Type *this_00;
  State *state;
  Variable *in_RDX;
  uint *extraout_RDX;
  Variable VVar4;
  undefined1 local_80 [8];
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Callback *call;
  undefined1 local_30 [8];
  Variable v;
  Variable *object_local;
  _Type_CLASS_OBJECT *this_local;
  
  v.nb_ref = (uint *)in_RDX;
  pOVar2 = Variable::operator->(in_RDX);
  pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
  Class::GetOperator((Class *)local_30,(OperatorType)pCVar3->ClassBase);
  pOVar2 = Variable::operator->((Variable *)local_30);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)v.nb_ref);
    pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
    if (pCVar3->ScriptState == (State *)0x0) {
      pOVar2 = Variable::operator->((Variable *)v.nb_ref);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    }
    else {
      pOVar2 = Variable::operator->((Variable *)local_30);
      state = (State *)Object::GetData<LiteScript::Callback>(pOVar2);
      Nullable<LiteScript::Variable>::Nullable
                ((Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(Variable *)v.nb_ref);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      Nullable<LiteScript::Variable>::~Nullable
                ((Nullable<LiteScript::Variable> *)
                 &args.
                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_80);
      pOVar2 = Variable::operator->((Variable *)v.nb_ref);
      pCVar3 = Object::GetData<LiteScript::ClassObject>(pOVar2);
      Callback::operator()
                ((Callback *)this,state,
                 (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                 pCVar3->ScriptState);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_80);
    }
  }
  else {
    pOVar2 = Variable::operator->((Variable *)v.nb_ref);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  }
  Variable::~Variable((Variable *)local_30);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OPostDecrement(Variable& object) const {
    Variable v = object->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_POST_DECR);
    if (v->GetType() == Type::CALLBACK) {
        if (object->GetData<ClassObject>().ScriptState == nullptr)
            return object->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object);
        std::vector<Variable> args;
        return call(*(object->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}